

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O2

SplittingStepCoefficients
SplittingStepCoefficients_ComposeStrang(int partitions,int order,int composition_stages)

{
  int iVar1;
  SplittingStepCoefficients pSVar2;
  
  if ((order & 1U) == 0 && 1 < order) {
    iVar1 = SUNIpowerI(composition_stages,((uint)order >> 1) - 1);
    pSVar2 = SplittingStepCoefficients_Alloc(1,(partitions + -1) * iVar1 + 1,partitions);
    if (pSVar2 != (SplittingStepCoefficients)0x0) {
      pSVar2->order = order;
      *pSVar2->alpha = 1.0;
      SplittingStepCoefficients_ComposeStrangHelper
                (partitions,order,composition_stages,0.0,1.0,*pSVar2->beta);
      return pSVar2;
    }
  }
  return (SplittingStepCoefficients)0x0;
}

Assistant:

static SplittingStepCoefficients SplittingStepCoefficients_ComposeStrang(
  const int partitions, const int order, const int composition_stages)
{
  if (order < 2 || order % 2 != 0)
  {
    // Only even orders allowed
    return NULL;
  }

  const int stages = 1 + (partitions - 1) *
                           SUNIpowerI(composition_stages, order / 2 - 1);
  const SplittingStepCoefficients coefficients =
    SplittingStepCoefficients_Alloc(1, stages, partitions);
  if (coefficients == NULL) { return NULL; }

  coefficients->order    = order;
  coefficients->alpha[0] = SUN_RCONST(1.0);

  SplittingStepCoefficients_ComposeStrangHelper(partitions, order,
                                                composition_stages,
                                                SUN_RCONST(0.0), SUN_RCONST(1.0),
                                                coefficients->beta[0]);

  return coefficients;
}